

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::removeLast(ArrayBuilder<kj::Exception::Detail> *this)

{
  RemoveConst<kj::Exception::Detail> *pRVar1;
  
  pRVar1 = this->pos;
  this->pos = pRVar1 + -1;
  Array<unsigned_char>::~Array(&pRVar1[-1].value);
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }